

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall Qclass_detAction_Test::TestBody(Qclass_detAction_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper AStack_16028;
  Message MStack_16020;
  int iStack_16018;
  int iStack_16014;
  undefined1 auStack_16010 [8];
  AssertionResult gtest_ar_1;
  Message MStack_15ff8;
  int aiStack_15ff0 [5];
  int iStack_15fdc;
  undefined1 auStack_15fd8 [8];
  AssertionResult gtest_ar;
  Qclass Test;
  Qclass_detAction_Test *this_local;
  
  Qclass::Qclass((Qclass *)&gtest_ar.message_);
  iStack_15fdc = Qclass::detAction((Qclass *)&gtest_ar.message_,2);
  aiStack_15ff0[0] = 4;
  testing::internal::CmpHelperLT<int,int>
            ((internal *)auStack_15fd8,"Test.detAction(2)","4",&iStack_15fdc,aiStack_15ff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)auStack_15fd8);
  if (!bVar1) {
    testing::Message::Message(&MStack_15ff8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)auStack_15fd8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&MStack_15ff8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&MStack_15ff8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)auStack_15fd8);
  iStack_16014 = Qclass::detAction((Qclass *)&gtest_ar.message_,3);
  iStack_16018 = -1;
  testing::internal::CmpHelperGT<int,int>
            ((internal *)auStack_16010,"Test.detAction(3)","-1",&iStack_16014,&iStack_16018);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)auStack_16010);
  if (!bVar1) {
    testing::Message::Message(&MStack_16020);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)auStack_16010);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_16028,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sudrag[P]Q-learning-for-2D-Occupancy-Grid/test/test.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_16028,&MStack_16020);
    testing::internal::AssertHelper::~AssertHelper(&AStack_16028);
    testing::Message::~Message(&MStack_16020);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)auStack_16010);
  Qclass::~Qclass((Qclass *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Qclass, detAction) {
  Qclass Test;
  EXPECT_LT(Test.detAction(2), 4);
  EXPECT_GT(Test.detAction(3), -1);
}